

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O1

mat4 * __thiscall Camera::getViewMatrix(mat4 *__return_storage_ptr__,Camera *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  dVar1 = cos((double)(this->rotation).field_0.field_0.x);
  dVar2 = sin((double)((this->rotation).field_0.field_0.y + 3.1415927));
  dVar3 = sin((double)(this->rotation).field_0.field_0.x);
  dVar4 = cos((double)(this->rotation).field_0.field_0.x);
  dVar5 = cos((double)((this->rotation).field_0.field_0.y + 3.1415927));
  fVar9 = (float)(dVar2 * dVar1);
  fVar10 = (float)dVar3;
  fVar6 = (float)(dVar5 * dVar4);
  dVar1 = sin((double)((this->rotation).field_0.field_0.y + 3.1415927 + -1.5707964));
  dVar2 = cos((double)((this->rotation).field_0.field_0.y + 3.1415927 + -1.5707964));
  fVar7 = (this->rotation).field_0.field_0.z * 57.29578;
  fVar8 = cosf(fVar7);
  fVar7 = sinf(fVar7);
  fVar13 = (float)dVar1 * fVar8 + fVar7 * -0.0;
  fVar7 = (float)dVar1 * fVar7 + fVar8 * 0.0;
  fVar17 = fVar7 * fVar6 - fVar10 * (float)dVar2;
  fVar11 = (float)dVar2 * fVar9 - fVar13 * fVar6;
  fVar14 = fVar13 * fVar10 - fVar7 * fVar9;
  fVar7 = (this->position).field_0.field_0.x;
  fVar8 = (this->position).field_0.field_0.y;
  fVar13 = (this->position).field_0.field_0.z;
  fVar15 = (fVar9 + fVar7) - fVar7;
  fVar10 = (fVar10 + fVar8) - fVar8;
  fVar9 = (fVar6 + fVar13) - fVar13;
  fVar6 = fVar9 * fVar9 + fVar10 * fVar10 + fVar15 * fVar15;
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  fVar6 = 1.0 / fVar6;
  fVar15 = fVar15 * fVar6;
  fVar10 = fVar10 * fVar6;
  fVar9 = fVar9 * fVar6;
  fVar16 = fVar10 * fVar14 - fVar9 * fVar11;
  fVar14 = fVar9 * fVar17 - fVar14 * fVar15;
  fVar11 = fVar11 * fVar15 - fVar17 * fVar10;
  fVar6 = fVar11 * fVar11 + fVar14 * fVar14 + fVar16 * fVar16;
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  fVar6 = 1.0 / fVar6;
  fVar16 = fVar16 * fVar6;
  fVar14 = fVar14 * fVar6;
  fVar6 = fVar6 * fVar11;
  fVar11 = fVar14 * fVar9 - fVar6 * fVar10;
  fVar17 = fVar6 * fVar15 - fVar16 * fVar9;
  fVar12 = fVar16 * fVar10 - fVar14 * fVar15;
  *(undefined8 *)&__return_storage_ptr__->value[1].field_0 = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->value[1].field_0 + 8) = 0;
  *(undefined8 *)&__return_storage_ptr__->value[0].field_0 = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->value[0].field_0 + 8) = 0;
  *(undefined8 *)&__return_storage_ptr__->value[2].field_0 = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->value[2].field_0 + 8) = 0;
  *(undefined8 *)&__return_storage_ptr__->value[3].field_0 = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->value[3].field_0 + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->value[0].field_0 + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->value[0].field_0 + 0xc) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->value[1].field_0 + 8) = 0;
  *(undefined8 *)&__return_storage_ptr__->value[2].field_0 = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->value[2].field_0 + 0xc) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->value[3].field_0 + 4) = 0;
  __return_storage_ptr__->value[3].field_0.field_0.w = 1.0;
  __return_storage_ptr__->value[0].field_0.field_0.x = fVar16;
  __return_storage_ptr__->value[1].field_0.field_0.x = fVar14;
  __return_storage_ptr__->value[2].field_0.field_0.x = fVar6;
  __return_storage_ptr__->value[0].field_0.field_0.y = fVar11;
  __return_storage_ptr__->value[1].field_0.field_0.y = fVar17;
  __return_storage_ptr__->value[2].field_0.field_0.y = fVar12;
  __return_storage_ptr__->value[0].field_0.field_0.z = -fVar15;
  __return_storage_ptr__->value[1].field_0.field_0.z = -fVar10;
  __return_storage_ptr__->value[2].field_0.field_0.z = -fVar9;
  __return_storage_ptr__->value[3].field_0.field_0.x =
       -(fVar6 * fVar13 + fVar14 * fVar8 + fVar16 * fVar7);
  __return_storage_ptr__->value[3].field_0.field_0.y =
       -(fVar12 * fVar13 + fVar17 * fVar8 + fVar11 * fVar7);
  __return_storage_ptr__->value[3].field_0.field_0.z =
       fVar13 * fVar9 + fVar8 * fVar10 + fVar7 * fVar15;
  return __return_storage_ptr__;
}

Assistant:

glm::mat4 Camera::getViewMatrix()
{
	float halfPI = 1.57079632679f;
	glm::vec3 direction = glm::vec3(
		cos(rotation.x) * sin(rotation.y + 3.14159265359f),
		sin(rotation.x),
		cos(rotation.x) * cos(rotation.y + 3.14159265359f)
	);
	
	glm::vec3 right = glm::vec3(
		sin(rotation.y + 3.14159265359f - halfPI),
		0,
		cos(rotation.y + 3.14159265359f - halfPI)
	);
	right = glm::rotateZ(right, rotation.z*57.2957795f );

	glm::vec3 up = glm::cross(right, direction);

	glm::vec3 pos = glm::vec3(position.x, position.y, position.z);

	return glm::lookAt(
		pos,
		pos + direction,
		up
	);
}